

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O0

int X509_VERIFY_PARAM_set1_policies(X509_VERIFY_PARAM *param,stack_st_ASN1_OBJECT *policies)

{
  long lVar1;
  stack_st_ASN1_OBJECT *psVar2;
  stack_st_ASN1_OBJECT *policies_local;
  X509_VERIFY_PARAM *param_local;
  
  if (param == (X509_VERIFY_PARAM *)0x0) {
    param_local._4_4_ = 0;
  }
  else {
    sk_ASN1_OBJECT_pop_free(*(stack_st_ASN1_OBJECT **)&param->purpose,ASN1_OBJECT_free);
    if (policies == (stack_st_ASN1_OBJECT *)0x0) {
      param->purpose = 0;
      param->trust = 0;
      param_local._4_4_ = 1;
    }
    else {
      psVar2 = sk_ASN1_OBJECT_deep_copy((stack_st_ASN1_OBJECT *)policies,OBJ_dup,ASN1_OBJECT_free);
      *(stack_st_ASN1_OBJECT **)&param->purpose = psVar2;
      lVar1._0_4_ = param->purpose;
      lVar1._4_4_ = param->trust;
      if (lVar1 == 0) {
        param_local._4_4_ = 0;
      }
      else {
        param_local._4_4_ = 1;
      }
    }
  }
  return param_local._4_4_;
}

Assistant:

int X509_VERIFY_PARAM_set1_policies(X509_VERIFY_PARAM *param,
                                    const STACK_OF(ASN1_OBJECT) *policies) {
  if (!param) {
    return 0;
  }

  sk_ASN1_OBJECT_pop_free(param->policies, ASN1_OBJECT_free);
  if (!policies) {
    param->policies = NULL;
    return 1;
  }

  param->policies =
      sk_ASN1_OBJECT_deep_copy(policies, OBJ_dup, ASN1_OBJECT_free);
  if (!param->policies) {
    return 0;
  }

  return 1;
}